

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::read_from_stream
          (mipmapped_texture *this,data_stream_serializer *serializer,format file_format)

{
  bool bVar1;
  data_stream *pdVar2;
  dynamic_string *pdVar3;
  char *pFilename;
  bool local_25;
  format local_24;
  bool success;
  format file_format_local;
  data_stream_serializer *serializer_local;
  mipmapped_texture *this_local;
  
  clear(this);
  pdVar2 = data_stream_serializer::get_stream(serializer);
  if (pdVar2 == (data_stream *)0x0) {
    set_last_error(this,"Invalid stream");
    this_local._7_1_ = false;
  }
  else {
    local_24 = file_format;
    if (file_format == cFormatInvalid) {
      pdVar3 = data_stream_serializer::get_name(serializer);
      pFilename = dynamic_string::get_ptr(pdVar3);
      local_24 = texture_file_types::determine_file_format(pFilename);
    }
    if (local_24 == cFormatInvalid) {
      set_last_error(this,"Unsupported file format");
      this_local._7_1_ = false;
    }
    else {
      set_last_error(this,"Image file load failed");
      local_25 = false;
      bVar1 = texture_file_types::supports_mipmaps(local_24);
      if (bVar1) {
        if (local_24 == cFormatDDS) {
          local_25 = read_dds(this,serializer);
        }
        else if (local_24 == cFormatCRN) {
          local_25 = read_crn(this,serializer);
        }
        else if (local_24 == cFormatKTX) {
          local_25 = read_ktx(this,serializer);
        }
      }
      else {
        local_25 = read_regular_image(this,serializer);
      }
      if (local_25 != false) {
        this->m_source_file_type = local_24;
        pdVar3 = data_stream_serializer::get_name(serializer);
        set_name(this,pdVar3);
        clear_last_error(this);
      }
      this_local._7_1_ = local_25;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::read_from_stream(data_stream_serializer& serializer, texture_file_types::format file_format) {
  clear();

  if (!serializer.get_stream()) {
    set_last_error("Invalid stream");
    return false;
  }

  if (file_format == texture_file_types::cFormatInvalid)
    file_format = texture_file_types::determine_file_format(serializer.get_name().get_ptr());

  if (file_format == texture_file_types::cFormatInvalid) {
    set_last_error("Unsupported file format");
    return false;
  }

  set_last_error("Image file load failed");

  bool success = false;

  if (!texture_file_types::supports_mipmaps(file_format)) {
    success = read_regular_image(serializer);
  } else {
    switch (file_format) {
      case texture_file_types::cFormatDDS: {
        success = read_dds(serializer);
        break;
      }
      case texture_file_types::cFormatCRN: {
        success = read_crn(serializer);
        break;
      }
      case texture_file_types::cFormatKTX: {
        success = read_ktx(serializer);
        break;
      }
      default: {
        CRNLIB_ASSERT(0);
        break;
      }
    }
  }

  if (success) {
    CRNLIB_ASSERT(check());

    m_source_file_type = file_format;
    set_name(serializer.get_name());
    clear_last_error();
  }

  return success;
}